

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MixedContentModel.cpp
# Opt level: O1

bool __thiscall
xercesc_4_0::MixedContentModel::validateContentSpecial
          (MixedContentModel *this,QName **children,XMLSize_t childCount,uint param_3,
          GrammarResolver *pGrammarResolver,XMLStringPool *pStringPool,XMLSize_t *indexFailingChild,
          MemoryManager *param_7)

{
  NodeTypes NVar1;
  QName *pQVar2;
  QName *exemplar;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  XMLSize_t XVar11;
  SubstitutionGroupComparator comparator;
  SubstitutionGroupComparator local_40;
  
  local_40.fGrammarResolver = pGrammarResolver;
  local_40.fStringPool = pStringPool;
  if (this->fOrdered == false) {
    if (childCount != 0) {
      uVar8 = 0;
      do {
        pQVar2 = children[uVar8];
        iVar5 = 7;
        if (pQVar2->fURIId != 0xffffffff) {
          if (this->fCount == 0) {
            XVar11 = 0;
          }
          else {
            uVar7 = 1;
            XVar11 = 0;
            do {
              if ((uint)this->fChildTypes[XVar11] < 9) {
                exemplar = this->fChildren[XVar11];
                bVar3 = true;
                switch(this->fChildTypes[XVar11]) {
                case Leaf:
                  bVar4 = SubstitutionGroupComparator::isEquivalentTo(&local_40,pQVar2,exemplar);
                  if (!bVar4) goto switchD_002f5b8d_caseD_1;
                  break;
                default:
                  goto switchD_002f5b8d_caseD_1;
                case Any:
                  break;
                case Any_Other:
                  if ((pQVar2->fURIId == 1) || (pQVar2->fURIId == exemplar->fURIId)) {
                    bVar3 = false;
                    bVar4 = true;
                  }
                  else {
                    bVar4 = false;
                  }
                  if (bVar4) goto switchD_002f5b8d_caseD_1;
                  break;
                case Any_NS:
                  if (exemplar->fURIId != pQVar2->fURIId) goto switchD_002f5b8d_caseD_1;
                }
              }
              else {
switchD_002f5b8d_caseD_1:
                bVar3 = false;
              }
              if (bVar3) break;
              XVar11 = (XMLSize_t)uVar7;
              uVar7 = uVar7 + 1;
            } while (XVar11 < this->fCount);
          }
          iVar5 = 0;
          if (this->fCount == XVar11) {
            *indexFailingChild = uVar8;
            iVar5 = 1;
          }
        }
        if ((iVar5 != 7) && (iVar5 != 0)) {
          return false;
        }
        uVar8 = (ulong)((int)uVar8 + 1);
      } while (uVar8 < childCount);
    }
  }
  else if (childCount != 0) {
    uVar9 = 0;
    uVar8 = 0;
    uVar10 = 1;
    do {
      uVar7 = children[uVar8]->fURIId;
      uVar6 = 4;
      if (uVar7 != 0xffffffff) {
        NVar1 = this->fChildTypes[uVar9];
        pQVar2 = this->fChildren[uVar9];
        if (NVar1 == Any_NS) {
          if (pQVar2->fURIId != uVar7) goto LAB_002f5ae9;
        }
        else if (NVar1 == Any_Other) {
          if ((uVar7 == 1) || (uVar7 == pQVar2->fURIId)) goto LAB_002f5ae9;
        }
        else if ((NVar1 == Leaf) &&
                (bVar3 = SubstitutionGroupComparator::isEquivalentTo
                                   (&local_40,children[uVar8],pQVar2), !bVar3)) {
LAB_002f5ae9:
          *indexFailingChild = uVar8;
          uVar6 = 1;
          goto LAB_002f5afb;
        }
        uVar9 = (ulong)((int)uVar9 + 1);
        uVar6 = 0;
      }
LAB_002f5afb:
      if ((uVar6 & 3) != 0) goto LAB_002f5b0f;
      bVar3 = uVar10 < childCount;
      uVar8 = uVar10;
      uVar10 = (ulong)((int)uVar10 + 1);
    } while (bVar3);
    uVar6 = 0;
LAB_002f5b0f:
    if (uVar6 != 0) {
      return false;
    }
  }
  return true;
}

Assistant:

bool MixedContentModel::validateContentSpecial(QName** const          children
                                            , XMLSize_t               childCount
                                            , unsigned int
                                            , GrammarResolver*  const pGrammarResolver
                                            , XMLStringPool*    const pStringPool
                                            , XMLSize_t*              indexFailingChild
                                            , MemoryManager*    const) const
{

    SubstitutionGroupComparator comparator(pGrammarResolver, pStringPool);

    // must match order
    if (fOrdered) {
        unsigned int inIndex = 0;
        for (unsigned int outIndex = 0; outIndex < childCount; outIndex++) {

            // Get the current child out of the source index
            QName* curChild = children[outIndex];

            // If its PCDATA, then we just accept that
            if (curChild->getURI() == XMLElementDecl::fgPCDataElemId)
                continue;

            ContentSpecNode::NodeTypes type = fChildTypes[inIndex];
            QName* inChild = fChildren[inIndex];

            if (type == ContentSpecNode::Leaf) {
                if ( !comparator.isEquivalentTo(curChild, inChild))
                {
                    *indexFailingChild=outIndex;
                    return false;
                }
            }
            else if (type == ContentSpecNode::Any) {
            }
            else if (type == ContentSpecNode::Any_NS) {
                if (inChild->getURI() != curChild->getURI())
                {
                    *indexFailingChild=outIndex;
                    return false;
                }
            }
            else if (type == ContentSpecNode::Any_Other)
            {
                // Here we assume that empty string has id 1.
                //
                unsigned int uriId = curChild->getURI();
                if (uriId == 1 || uriId == inChild->getURI())
                {
                    *indexFailingChild=outIndex;
                    return false;
                }
            }

            // advance index
            inIndex++;
        }
    }

    // can appear in any order
    else {
        for (unsigned int outIndex = 0; outIndex < childCount; outIndex++) {
            // Get the current child out of the source index
            QName* curChild = children[outIndex];

            // If its PCDATA, then we just accept that
            if (curChild->getURI() == XMLElementDecl::fgPCDataElemId)
                continue;

            // And try to find it in our list
            unsigned int inIndex = 0;
            for (; inIndex < fCount; inIndex++)
            {
                ContentSpecNode::NodeTypes type = fChildTypes[inIndex];
                QName* inChild = fChildren[inIndex];

                if (type == ContentSpecNode::Leaf) {
                    if ( comparator.isEquivalentTo(curChild, inChild))
                        break;
                }
                else if (type == ContentSpecNode::Any) {
                    break;
                }
                else if (type == ContentSpecNode::Any_NS) {
                    if (inChild->getURI() == curChild->getURI())
                        break;
                }
                else if (type == ContentSpecNode::Any_Other)
                {
                  // Here we assume that empty string has id 1.
                  //
                  unsigned int uriId = curChild->getURI();
                  if (uriId != 1 && uriId != inChild->getURI())
                    break;
                }

                // REVISIT: What about checking for multiple ANY matches?
                //          The content model ambiguity *could* be checked
                //          by the caller before constructing the mixed
                //          content model.
            }
            // We did not find this one, so the validation failed
            if (inIndex == fCount)
            {
                *indexFailingChild=outIndex;
                return false;
            }
        }
    }

    // Everything seems to be in order, so return success
    return true;
}